

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

int __thiscall Catch::TestCaseTracking::TrackerBase::close(TrackerBase *this,int __fd)

{
  pointer pPVar1;
  int iVar2;
  TrackerContext *pTVar3;
  logic_error *this_00;
  
  pTVar3 = this->m_ctx;
  while ((TrackerBase *)pTVar3->m_currentTracker != this) {
    (*(((TrackerBase *)pTVar3->m_currentTracker)->super_ITracker).super_SharedImpl<Catch::IShared>.
      super_IShared.super_NonCopyable._vptr_NonCopyable[10])();
    pTVar3 = this->m_ctx;
  }
  switch(this->m_runState) {
  case NotStarted:
  case CompletedSuccessfully:
  case Failed:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Illogical state");
    break;
  case ExecutingChildren:
    pPVar1 = (this->m_children).
             super__Vector_base<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (((this->m_children).
         super__Vector_base<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>
         ._M_impl.super__Vector_impl_data._M_start != pPVar1) &&
       (iVar2 = (*((pPVar1[-1].m_p)->super_SharedImpl<Catch::IShared>).super_IShared.
                  super_NonCopyable._vptr_NonCopyable[5])(), (char)iVar2 == '\0'))
    goto switchD_0014b7ef_caseD_3;
  case Executing:
    this->m_runState = CompletedSuccessfully;
  case NeedsAnotherRun:
switchD_0014b7ef_caseD_3:
    if (this->m_parent == (ITracker *)0x0) {
      __assert_fail("m_parent",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/test/catch.hpp"
                    ,0x153c,"void Catch::TestCaseTracking::TrackerBase::moveToParent()");
    }
    this->m_ctx->m_currentTracker = this->m_parent;
    pTVar3 = this->m_ctx;
    pTVar3->m_runState = CompletedCycle;
    return (int)pTVar3;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Unexpected state");
  }
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

virtual void close() CATCH_OVERRIDE {

            // Close any still open children (e.g. generators)
            while( &m_ctx.currentTracker() != this )
                m_ctx.currentTracker().close();

            switch( m_runState ) {
                case NotStarted:
                case CompletedSuccessfully:
                case Failed:
                    throw std::logic_error( "Illogical state" );

                case NeedsAnotherRun:
                    break;;

                case Executing:
                    m_runState = CompletedSuccessfully;
                    break;
                case ExecutingChildren:
                    if( m_children.empty() || m_children.back()->isComplete() )
                        m_runState = CompletedSuccessfully;
                    break;

                default:
                    throw std::logic_error( "Unexpected state" );
            }
            moveToParent();
            m_ctx.completeCycle();
        }